

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

int sock_init_with_ip(SOCKINFO *info,SOCKET sockfd,sockaddr *foreign_sockaddr)

{
  sock_init(info,sockfd);
  memcpy(&info->foreign_sockaddr,foreign_sockaddr,0x80);
  return 0;
}

Assistant:

int sock_init_with_ip(
	SOCKINFO *info, SOCKET sockfd, struct sockaddr *foreign_sockaddr)
{
	int ret;

	ret = sock_init(info, sockfd);
	if (ret != UPNP_E_SUCCESS) {
		return ret;
	}

	memcpy(&info->foreign_sockaddr,
		foreign_sockaddr,
		sizeof(info->foreign_sockaddr));

	return UPNP_E_SUCCESS;
}